

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomTestData<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
RandomTestData(RandomTestData<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *this,uchar in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  const_iterator local_30;
  size_t local_28;
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  RandomTestData<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pRStack_10;
  uchar in_delim_local;
  RandomTestData<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_local;
  
  local_28 = in_fixed_word_length;
  in_fixed_word_length_local = in_fixed_word_count;
  in_fixed_word_count_local._7_1_ = in_delim;
  pRStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_delim);
  this->m_fixed_word_count = in_fixed_word_length_local;
  this->m_fixed_word_length = local_28;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_str);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&this->m_tokens);
  local_38._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_delim);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_30,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&this->m_delim,local_30,(value_type_conflict4 *)((long)&in_fixed_word_count_local + 7))
  ;
  populate(this);
  return;
}

Assistant:

RandomTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}